

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int __thiscall testing::UnitTest::total_test_count(UnitTest *this)

{
  long lVar1;
  int iVar2;
  UnitTestImpl *this_00;
  long in_FS_OFFSET;
  UnitTest *this_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = impl(this);
  iVar2 = internal::UnitTestImpl::total_test_count(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int UnitTest::total_test_count() const { return impl()->total_test_count(); }